

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bestfit.cpp
# Opt level: O2

bool getBestFitPlane(uint vcount,float *points,uint vstride,float *weights,uint wstride,float *plane
                    )

{
  float fVar1;
  float *pfVar2;
  uint uVar3;
  float *pfVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Eigen local_50;
  
  pfVar2 = points + 2;
  auVar11 = ZEXT816(0) << 0x40;
  auVar10 = ZEXT816(0) << 0x40;
  local_50.mElement[2][1] = 0.0;
  pfVar4 = weights;
  uVar3 = vcount;
  while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
    if (pfVar4 == (float *)0x0) {
      auVar8 = SUB6416(ZEXT464(0x3f800000),0);
      pfVar4 = (float *)0x0;
    }
    else {
      auVar8 = ZEXT416((uint)*pfVar4);
      pfVar4 = (float *)((long)pfVar4 + (ulong)wstride);
    }
    auVar10 = vfmadd231ss_fma(auVar10,auVar8,ZEXT416((uint)*pfVar2));
    auVar12._8_8_ = 0;
    auVar12._0_8_ = *(ulong *)(pfVar2 + -2);
    fVar9 = auVar8._0_4_;
    auVar8._4_4_ = fVar9;
    auVar8._0_4_ = fVar9;
    auVar8._8_4_ = fVar9;
    auVar8._12_4_ = fVar9;
    local_50.mElement[2][1] = local_50.mElement[2][1] + fVar9;
    pfVar2 = (float *)((long)pfVar2 + (ulong)vstride);
    auVar11 = vfmadd231ps_fma(auVar11,auVar12,auVar8);
  }
  pfVar2 = points + 2;
  local_50.mElement[2][1] = 1.0 / local_50.mElement[2][1];
  fVar9 = auVar10._0_4_ * local_50.mElement[2][1];
  auVar10 = ZEXT816(0) << 0x20;
  auVar16._0_4_ = auVar11._0_4_ * local_50.mElement[2][1];
  auVar16._4_4_ = auVar11._4_4_ * local_50.mElement[2][1];
  auVar16._8_4_ = auVar11._8_4_ * local_50.mElement[2][1];
  auVar16._12_4_ = auVar11._12_4_ * local_50.mElement[2][1];
  auVar8 = ZEXT816(0) << 0x20;
  auVar11 = ZEXT416(0) << 0x20;
  while (bVar5 = vcount != 0, vcount = vcount - 1, bVar5) {
    if (weights == (float *)0x0) {
      weights = (float *)0x0;
      fVar13 = 1.0;
    }
    else {
      fVar13 = *weights;
      weights = (float *)((long)weights + (ulong)wstride);
    }
    auVar14._8_8_ = 0;
    auVar14._0_8_ = *(ulong *)(pfVar2 + -2);
    fVar1 = *pfVar2;
    pfVar2 = (float *)((long)pfVar2 + (ulong)vstride);
    auVar14 = vsubps_avx(auVar14,auVar16);
    auVar6._0_8_ = CONCAT44(fVar13 * auVar14._4_4_,fVar13 * auVar14._0_4_);
    auVar6._8_4_ = fVar13 * auVar14._8_4_;
    auVar6._12_4_ = fVar13 * auVar14._12_4_;
    fVar13 = (fVar1 - fVar9) * fVar13;
    auVar14 = vmovshdup_avx(auVar6);
    auVar15._8_8_ = auVar6._0_8_;
    auVar15._0_8_ = auVar6._0_8_;
    auVar6 = vpermt2ps_avx512vl(auVar6,_DAT_00f60a00,ZEXT416((uint)fVar13));
    auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar13),ZEXT416((uint)fVar13));
    auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar13),auVar14);
    auVar10 = vfmadd231ps_fma(auVar10,auVar15,auVar6);
  }
  auVar7._0_4_ = auVar8._0_4_;
  auVar7._4_4_ = auVar7._0_4_;
  auVar7._8_4_ = auVar7._0_4_;
  auVar7._12_4_ = auVar7._0_4_;
  auVar7._16_4_ = auVar7._0_4_;
  auVar7._20_4_ = auVar7._0_4_;
  auVar7._24_4_ = auVar7._0_4_;
  auVar7._28_4_ = auVar7._0_4_;
  local_50.mElement[2][2] = local_50.mElement[2][1] * auVar11._0_4_;
  auVar7 = vpermi2ps_avx512vl(_DAT_00f60a20,ZEXT1632(auVar10),auVar7);
  local_50.mElement[0][0] = local_50.mElement[2][1] * auVar7._0_4_;
  local_50.mElement[0][1] = local_50.mElement[2][1] * auVar7._4_4_;
  local_50.mElement[0][2] = local_50.mElement[2][1] * auVar7._8_4_;
  local_50.mElement[1][0] = local_50.mElement[2][1] * auVar7._12_4_;
  local_50.mElement[1][1] = local_50.mElement[2][1] * auVar7._16_4_;
  local_50.mElement[1][2] = local_50.mElement[2][1] * auVar7._20_4_;
  local_50.mElement[2][0] = local_50.mElement[2][1] * auVar7._24_4_;
  BestFit::Eigen::DecrSortEigenStuff(&local_50);
  auVar11 = vmovshdup_avx(auVar16);
  *plane = local_50.mElement[0][2];
  plane[1] = local_50.mElement[1][2];
  plane[2] = local_50.mElement[2][2];
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * local_50.mElement[1][2])),
                            ZEXT416((uint)local_50.mElement[0][2]),auVar16);
  auVar11 = vfmadd213ss_fma(ZEXT416((uint)fVar9),ZEXT416((uint)local_50.mElement[2][2]),auVar11);
  plane[3] = 0.0 - auVar11._0_4_;
  return false;
}

Assistant:

bool getBestFitPlane(unsigned int vcount,
                     const float *points,
                     unsigned int vstride,
                     const float *weights,
                     unsigned int wstride,
                     float *plane)
{
  bool ret = false;

  Vec3 kOrigin(0,0,0);

  float wtotal = 0;

  if ( 1 )
  {
    const char *source  = (const char *) points;
    const char *wsource = (const char *) weights;

    for (unsigned int i=0; i<vcount; i++)
    {

      const float *p = (const float *) source;

      float w = 1;

      if ( wsource )
      {
        const float *ws = (const float *) wsource;
        w = *ws; //
        wsource+=wstride;
      }

      kOrigin.x+=p[0]*w;
      kOrigin.y+=p[1]*w;
      kOrigin.z+=p[2]*w;

      wtotal+=w;

      source+=vstride;
    }
  }

  float recip = 1.0f / wtotal; // reciprocol of total weighting

  kOrigin.x*=recip;
  kOrigin.y*=recip;
  kOrigin.z*=recip;


  float fSumXX=0;
  float fSumXY=0;
  float fSumXZ=0;

  float fSumYY=0;
  float fSumYZ=0;
  float fSumZZ=0;


  if ( 1 )
  {
    const char *source  = (const char *) points;
    const char *wsource = (const char *) weights;

    for (unsigned int i=0; i<vcount; i++)
    {

      const float *p = (const float *) source;

      float w = 1;

      if ( wsource )
      {
        const float *ws = (const float *) wsource;
        w = *ws; //
        wsource+=wstride;
      }

      Vec3 kDiff;

      kDiff.x = w*(p[0] - kOrigin.x); // apply vertex weighting!
      kDiff.y = w*(p[1] - kOrigin.y);
      kDiff.z = w*(p[2] - kOrigin.z);

      fSumXX+= kDiff.x * kDiff.x; // sume of the squares of the differences.
      fSumXY+= kDiff.x * kDiff.y; // sume of the squares of the differences.
      fSumXZ+= kDiff.x * kDiff.z; // sume of the squares of the differences.

      fSumYY+= kDiff.y * kDiff.y;
      fSumYZ+= kDiff.y * kDiff.z;
      fSumZZ+= kDiff.z * kDiff.z;


      source+=vstride;
    }
  }

  fSumXX *= recip;
  fSumXY *= recip;
  fSumXZ *= recip;
  fSumYY *= recip;
  fSumYZ *= recip;
  fSumZZ *= recip;

  // setup the eigensolver
  Eigen kES;

  kES.mElement[0][0] = fSumXX;
  kES.mElement[0][1] = fSumXY;
  kES.mElement[0][2] = fSumXZ;

  kES.mElement[1][0] = fSumXY;
  kES.mElement[1][1] = fSumYY;
  kES.mElement[1][2] = fSumYZ;

  kES.mElement[2][0] = fSumXZ;
  kES.mElement[2][1] = fSumYZ;
  kES.mElement[2][2] = fSumZZ;

  // compute eigenstuff, smallest eigenvalue is in last position
  kES.DecrSortEigenStuff();

  Vec3 kNormal;

  kNormal.x = kES.mElement[0][2];
  kNormal.y = kES.mElement[1][2];
  kNormal.z = kES.mElement[2][2];

  // the minimum energy
  plane[0] = kNormal.x;
  plane[1] = kNormal.y;
  plane[2] = kNormal.z;

  plane[3] = 0 - kNormal.dot(kOrigin);

  return ret;
}